

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O0

cx_string<6UL>
mserialize::cx_strcat<2ul,2ul,2ul>
          (cx_string<2UL> *strings,cx_string<2UL> *strings_1,cx_string<2UL> *strings_2)

{
  cx_string<6UL> cVar1;
  cx_string<2UL> *in_RDX;
  cx_string<2UL> *in_RSI;
  cx_string<2UL> *in_RDI;
  size_t s;
  size_t i;
  char *out;
  size_t size [4];
  char *data [4];
  char buffer [7];
  ulong local_80;
  ulong local_78;
  char *local_70;
  ulong local_68;
  size_t local_60;
  size_t local_58;
  size_t local_50;
  char *local_48;
  data_ref local_40;
  data_ref local_38;
  data_ref local_30;
  char local_27 [7];
  cx_string<2UL> *local_20;
  cx_string<2UL> *local_18;
  cx_string<2UL> *local_10;
  cx_string<6UL> local_7;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(local_27,0,7);
  local_48 = "";
  local_40 = cx_string<2UL>::data(local_10);
  local_38 = cx_string<2UL>::data(local_18);
  local_30 = cx_string<2UL>::data(local_20);
  local_68 = 0;
  local_60 = cx_string<2UL>::size(local_10);
  local_58 = cx_string<2UL>::size(local_18);
  local_50 = cx_string<2UL>::size(local_20);
  local_70 = local_27;
  for (local_78 = 1; local_78 < 4; local_78 = local_78 + 1) {
    for (local_80 = 0; local_80 < (&local_68)[local_78]; local_80 = local_80 + 1) {
      *local_70 = (&local_48)[local_78][local_80];
      local_70 = local_70 + 1;
    }
  }
  cx_string<6UL>::cx_string(&local_7,local_27);
  cVar1._data[0] = local_7._data[0];
  cVar1._data[1] = local_7._data[1];
  cVar1._data[2] = local_7._data[2];
  cVar1._data[3] = local_7._data[3];
  cVar1._data[4] = local_7._data[4];
  cVar1._data[5] = local_7._data[5];
  cVar1._data[6] = local_7._data[6];
  return (cx_string<6UL>)cVar1._data;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}